

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

BinaryOp __thiscall
wasm::Random::pick<wasm::BinaryOp>(Random *this,FeatureOptions<wasm::BinaryOp> *picker)

{
  BinaryOp BVar1;
  value_type *pvVar2;
  _Vector_base<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_> local_30;
  
  items<wasm::BinaryOp>
            ((vector<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_> *)&local_30,this,picker);
  pvVar2 = pick<std::vector<wasm::BinaryOp,std::allocator<wasm::BinaryOp>>>
                     (this,(vector<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_> *)&local_30);
  BVar1 = *pvVar2;
  std::_Vector_base<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>::~_Vector_base(&local_30);
  return BVar1;
}

Assistant:

const T pick(FeatureOptions<T>& picker) {
    return pick(items(picker));
  }